

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall
curlpp::FormParts::Content::Content(Content *this,char *name,char *content,char *contentType)

{
  char *in_RCX;
  char *in_RDX;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffb8;
  FormPart *in_stack_ffffffffffffffc0;
  allocator *paVar1;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  FormPart::FormPart(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__Content_00162bd8;
  paVar1 = &local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 5),local_18,paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 9),local_20,local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  return;
}

Assistant:

curlpp::FormParts::Content::Content(const char * name, 
				    const char * content, const char * contentType)
  : FormPart(name)
  , mContent(content)
  , mContentType(contentType)
{}